

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

bool __thiscall QCompleter::eventFilter(QCompleter *this,QObject *o,QEvent *e)

{
  QModelIndex index;
  QModelIndex index_00;
  QModelIndex index_01;
  QModelIndex index_02;
  QModelIndex index_03;
  QModelIndex index_04;
  bool bVar1;
  byte bVar2;
  Type TVar3;
  int iVar4;
  int iVar5;
  Int IVar6;
  QCompleterPrivate *pQVar7;
  ulong uVar8;
  QWidget *pQVar9;
  QEvent *in_RDX;
  QEvent *in_RSI;
  totally_ordered_wrapper<const_QAbstractItemModel_*> in_RDI;
  long in_FS_OFFSET;
  int rowCount;
  int key;
  QKeyEvent *ke;
  QCompleterPrivate *d;
  QModelIndex firstIndex;
  QModelIndex lastIndex;
  QModelIndexList selList;
  QModelIndex curIndex;
  QPointer<QWidget> *in_stack_fffffffffffffdd8;
  KeyboardModifier other;
  QModelIndex *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  QWidget *in_stack_fffffffffffffdf8;
  QCompleterPrivate *in_stack_fffffffffffffe00;
  undefined1 uVar11;
  QCompletionModel *pQVar10;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined8 in_stack_fffffffffffffe40;
  Type in_stack_fffffffffffffe4c;
  bool local_171;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_16c;
  undefined1 *local_168;
  totally_ordered_wrapper<const_QAbstractItemModel_*> in_stack_fffffffffffffeb0;
  undefined1 local_138 [24];
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 local_108 [24];
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [24];
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 local_78 [24];
  undefined4 local_60;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_5c;
  undefined1 *local_58;
  undefined1 *local_50;
  QAbstractItemModel *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_18;
  QEvent *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  pQVar7 = d_func((QCompleter *)0xa6ea86);
  bVar1 = ::operator==((QObject **)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  other = (KeyboardModifier)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  if (bVar1) {
    in_stack_fffffffffffffe4c = QEvent::type(in_RDX);
    if (in_stack_fffffffffffffe4c == FocusOut) {
      if ((((pQVar7->eatFocusOut & 1U) != 0) &&
          (pQVar7->hiddenBecauseNoMatch = false, pQVar7->popup != (QAbstractItemView *)0x0)) &&
         (bVar1 = QWidget::isVisible((QWidget *)0xa6eb1e), bVar1)) {
        local_171 = true;
        goto LAB_00a6f588;
      }
    }
    else if ((in_stack_fffffffffffffe4c == Hide) && (pQVar7->popup != (QAbstractItemView *)0x0)) {
      QWidget::hide((QWidget *)0xa6eb5b);
    }
  }
  if (local_10 != (QEvent *)pQVar7->popup) {
    bVar2 = QObject::eventFilter((QObject *)in_RDI.ptr,local_10);
    local_171 = (bool)(bVar2 & 1);
    goto LAB_00a6f588;
  }
  TVar3 = QEvent::type(in_RDX);
  if (TVar3 == MouseButtonPress) {
    bVar1 = QWidget::underMouse((QWidget *)0xa6f4e8);
    if (bVar1) {
      local_171 = false;
    }
    else {
      uVar8 = QGuiApplicationPrivate::maybeForwardEventToVirtualKeyboard(in_RDX);
      if ((uVar8 & 1) == 0) {
        QWidget::hide((QWidget *)0xa6f511);
      }
      local_171 = true;
    }
    goto LAB_00a6f588;
  }
  if (TVar3 == MouseButtonRelease) {
    QGuiApplicationPrivate::maybeForwardEventToVirtualKeyboard(in_RDX);
    local_171 = true;
    goto LAB_00a6f588;
  }
  if (TVar3 != KeyPress) {
    if ((TVar3 == ShortcutOverride) || (TVar3 == InputMethod)) {
      bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0xa6f54d);
      if (bVar1) {
        pQVar9 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0xa6f564);
        QCoreApplication::sendEvent(&pQVar9->super_QObject,in_RDX);
      }
      local_171 = false;
    }
    else {
      local_171 = false;
    }
    goto LAB_00a6f588;
  }
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex
            ((QAbstractItemView *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_fffffffffffffde0);
  QItemSelectionModel::selectedIndexes();
  iVar4 = QKeyEvent::key((QKeyEvent *)in_RDX);
  if ((((iVar4 == 0x1000013) || (iVar4 == 0x1000015)) &&
      (bVar1 = QList<QModelIndex>::isEmpty((QList<QModelIndex> *)0xa6ece4), bVar1)) &&
     ((bVar1 = QModelIndex::isValid(in_stack_fffffffffffffde0), bVar1 &&
      (pQVar7->mode == UnfilteredPopupCompletion)))) {
    local_58 = local_28;
    local_50 = local_20;
    local_48 = local_18.ptr;
    index.i._0_4_ = TVar3;
    index.r = (int)in_stack_fffffffffffffe40;
    index.c = (int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
    index.i._4_4_ = in_stack_fffffffffffffe4c;
    index.m.ptr = in_RDI.ptr;
    QCompleterPrivate::setCurrentIndex
              ((QCompleterPrivate *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               index,SUB81((ulong)in_stack_fffffffffffffe00 >> 0x38,0));
    local_171 = true;
  }
  else {
    uVar8 = (ulong)(iVar4 + 0xfefffff0);
    switch(uVar8) {
    case 0:
    case 1:
      local_60 = QKeyEvent::modifiers();
      local_5c.super_QFlagsStorage<Qt::KeyboardModifier>.i =
           (QFlagsStorage<Qt::KeyboardModifier>)
           QFlags<Qt::KeyboardModifier>::operator&
                     ((QFlags<Qt::KeyboardModifier> *)in_stack_fffffffffffffde0,other);
      IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_5c);
      if (IVar6 == 0) goto switchD_00a6edbe_caseD_2;
      local_171 = false;
      break;
    default:
switchD_00a6edbe_caseD_2:
      bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0xa6f231);
      if (bVar1) {
        pQVar7->eatFocusOut = false;
        pQVar9 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0xa6f257);
        (**(code **)(*(long *)pQVar9 + 0x28))(pQVar9,in_RDX);
        pQVar7->eatFocusOut = true;
      }
      bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0xa6f288);
      if (((!bVar1) || (bVar1 = QEvent::isAccepted(in_RDX), bVar1)) ||
         (bVar1 = QWidget::isVisible((QWidget *)0xa6f2b3), !bVar1)) {
        bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0xa6f2c8);
        if (bVar1) {
          QPointer<QWidget>::operator->((QPointer<QWidget> *)0xa6f2df);
          bVar1 = QWidget::hasFocus(in_stack_fffffffffffffdf8);
          if (!bVar1) {
            QWidget::hide((QWidget *)0xa6f2ff);
          }
        }
        bVar1 = QEvent::isAccepted(in_RDX);
        if (bVar1) {
          local_171 = true;
          break;
        }
      }
      uVar11 = (undefined1)((ulong)in_stack_fffffffffffffdf8 >> 0x38);
      uVar8 = QKeyEvent::matches((StandardKey)in_RDX);
      if ((uVar8 & 1) == 0) {
        if (iVar4 == 0x1000001) {
LAB_00a6f3b9:
          QWidget::hide((QWidget *)0xa6f3cd);
          bVar1 = QModelIndex::isValid(in_stack_fffffffffffffde0);
          if (bVar1) {
            local_168 = local_28;
            index_04.i = (quintptr)local_18.ptr;
            index_04._0_8_ = local_20;
            index_04.m.ptr = in_stack_fffffffffffffeb0.ptr;
            QCompleterPrivate::_q_complete(in_stack_fffffffffffffe00,index_04,(bool)uVar11);
          }
        }
        else if (iVar4 == 0x1000002) {
          QWidget::hide((QWidget *)0xa6f4ab);
        }
        else {
          if (iVar4 + 0xfefffffcU < 2) goto LAB_00a6f3b9;
          if (iVar4 == 0x1000033) {
            QKeyEvent::modifiers();
            local_16c.super_QFlagsStorage<Qt::KeyboardModifier>.i =
                 (QFlagsStorage<Qt::KeyboardModifier>)
                 QFlags<Qt::KeyboardModifier>::operator&
                           ((QFlags<Qt::KeyboardModifier> *)in_stack_fffffffffffffde0,other);
            IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_16c);
            if (IVar6 != 0) {
              QWidget::hide((QWidget *)0xa6f495);
            }
          }
        }
        local_171 = true;
      }
      else {
        QWidget::hide((QWidget *)0xa6f358);
        local_171 = true;
      }
      break;
    case 3:
      bVar1 = QModelIndex::isValid(in_stack_fffffffffffffde0);
      uVar11 = (undefined1)((ulong)in_stack_fffffffffffffe00 >> 0x38);
      if (bVar1) {
        iVar4 = QModelIndex::row((QModelIndex *)&local_28);
        if (iVar4 == 0) {
          if ((pQVar7->wrap & 1U) != 0) {
            QModelIndex::QModelIndex((QModelIndex *)0xa6efb6);
            index_01.i._0_4_ = TVar3;
            index_01.r = (int)uVar8;
            index_01.c = (int)(uVar8 >> 0x20);
            index_01.i._4_4_ = in_stack_fffffffffffffe4c;
            index_01.m.ptr = in_RDI.ptr;
            QCompleterPrivate::setCurrentIndex
                      ((QCompleterPrivate *)
                       CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),index_01,
                       (bool)uVar11);
          }
          local_171 = true;
        }
        else {
          local_171 = false;
        }
      }
      else {
        pQVar10 = pQVar7->proxy;
        QModelIndex::QModelIndex((QModelIndex *)0xa6ee53);
        iVar5 = (**(code **)(*(long *)pQVar10 + 0x78))(pQVar10,local_78);
        local_90 = &DAT_aaaaaaaaaaaaaaaa;
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        local_80 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar10 = pQVar7->proxy;
        iVar4 = pQVar7->column;
        QModelIndex::QModelIndex((QModelIndex *)0xa6eedb);
        (**(code **)(*(long *)pQVar10 + 0x60))(&local_90,pQVar10,iVar5 + -1,iVar4,local_a8);
        local_c0 = local_90;
        local_b8 = local_88;
        local_b0 = local_80;
        index_00.i._0_4_ = TVar3;
        index_00.r = (int)uVar8;
        index_00.c = (int)(uVar8 >> 0x20);
        index_00.i._4_4_ = in_stack_fffffffffffffe4c;
        index_00.m.ptr = in_RDI.ptr;
        QCompleterPrivate::setCurrentIndex
                  ((QCompleterPrivate *)
                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),index_00,
                   (bool)uVar11);
        local_171 = true;
      }
      break;
    case 5:
      bVar1 = QModelIndex::isValid(in_stack_fffffffffffffde0);
      uVar11 = (undefined1)((ulong)in_stack_fffffffffffffe00 >> 0x38);
      if (bVar1) {
        iVar4 = QModelIndex::row((QModelIndex *)&local_28);
        pQVar10 = pQVar7->proxy;
        QModelIndex::QModelIndex((QModelIndex *)0xa6f15b);
        iVar5 = (**(code **)(*(long *)pQVar10 + 0x78))(pQVar10,local_138);
        uVar11 = (undefined1)((ulong)pQVar10 >> 0x38);
        if (iVar4 == iVar5 + -1) {
          if ((pQVar7->wrap & 1U) != 0) {
            QModelIndex::QModelIndex((QModelIndex *)0xa6f1a6);
            index_03.i._0_4_ = TVar3;
            index_03.r = (int)uVar8;
            index_03.c = (int)(uVar8 >> 0x20);
            index_03.i._4_4_ = in_stack_fffffffffffffe4c;
            index_03.m.ptr = in_RDI.ptr;
            QCompleterPrivate::setCurrentIndex
                      ((QCompleterPrivate *)CONCAT44(iVar4,in_stack_fffffffffffffe08),index_03,
                       (bool)uVar11);
          }
          local_171 = true;
        }
        else {
          local_171 = false;
        }
      }
      else {
        local_f0 = &DAT_aaaaaaaaaaaaaaaa;
        local_e8 = &DAT_aaaaaaaaaaaaaaaa;
        local_e0 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar10 = pQVar7->proxy;
        iVar4 = pQVar7->column;
        QModelIndex::QModelIndex((QModelIndex *)0xa6f08d);
        (**(code **)(*(long *)pQVar10 + 0x60))(&local_f0,pQVar10,0,iVar4,local_108);
        local_120 = local_f0;
        local_118 = local_e8;
        local_110 = local_e0;
        index_02.i._0_4_ = TVar3;
        index_02.r = (int)uVar8;
        index_02.c = (int)(uVar8 >> 0x20);
        index_02.i._4_4_ = in_stack_fffffffffffffe4c;
        index_02.m.ptr = in_RDI.ptr;
        QCompleterPrivate::setCurrentIndex
                  ((QCompleterPrivate *)
                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),index_02,
                   (bool)uVar11);
        local_171 = true;
      }
      break;
    case 6:
    case 7:
      local_171 = false;
    }
  }
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0xa6f4cf);
LAB_00a6f588:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_171;
  }
  __stack_chk_fail();
}

Assistant:

bool QCompleter::eventFilter(QObject *o, QEvent *e)
{
    Q_D(QCompleter);

    if (o == d->widget) {
        switch (e->type()) {
        case QEvent::FocusOut:
            if (d->eatFocusOut) {
                d->hiddenBecauseNoMatch = false;
                if (d->popup && d->popup->isVisible())
                    return true;
            }
            break;
        case QEvent::Hide:
            if (d->popup)
                d->popup->hide();
            break;
        default:
            break;
        }
    }

    if (o != d->popup)
        return QObject::eventFilter(o, e);

    Q_ASSERT(d->popup);
    switch (e->type()) {
    case QEvent::KeyPress: {
        QKeyEvent *ke = static_cast<QKeyEvent *>(e);

        QModelIndex curIndex = d->popup->currentIndex();
        QModelIndexList selList = d->popup->selectionModel()->selectedIndexes();

        const int key = ke->key();
        // In UnFilteredPopup mode, select the current item
        if ((key == Qt::Key_Up || key == Qt::Key_Down) && selList.isEmpty() && curIndex.isValid()
            && d->mode == QCompleter::UnfilteredPopupCompletion) {
              d->setCurrentIndex(curIndex);
              return true;
        }

        // Handle popup navigation keys. These are hardcoded because up/down might make the
        // widget do something else (lineedit cursor moves to home/end on mac, for instance)
        switch (key) {
        case Qt::Key_End:
        case Qt::Key_Home:
            if (ke->modifiers() & Qt::ControlModifier)
                return false;
            break;

        case Qt::Key_Up:
            if (!curIndex.isValid()) {
                int rowCount = d->proxy->rowCount();
                QModelIndex lastIndex = d->proxy->index(rowCount - 1, d->column);
                d->setCurrentIndex(lastIndex);
                return true;
            } else if (curIndex.row() == 0) {
                if (d->wrap)
                    d->setCurrentIndex(QModelIndex());
                return true;
            }
            return false;

        case Qt::Key_Down:
            if (!curIndex.isValid()) {
                QModelIndex firstIndex = d->proxy->index(0, d->column);
                d->setCurrentIndex(firstIndex);
                return true;
            } else if (curIndex.row() == d->proxy->rowCount() - 1) {
                if (d->wrap)
                    d->setCurrentIndex(QModelIndex());
                return true;
            }
            return false;

        case Qt::Key_PageUp:
        case Qt::Key_PageDown:
            return false;
        }

        if (d->widget) {
            // Send the event to the widget. If the widget accepted the event, do nothing
            // If the widget did not accept the event, provide a default implementation
            d->eatFocusOut = false;
            (static_cast<QObject *>(d->widget))->event(ke);
            d->eatFocusOut = true;
        }
        if (!d->widget || e->isAccepted() || !d->popup->isVisible()) {
            // widget lost focus, hide the popup
            if (d->widget && (!d->widget->hasFocus()
#ifdef QT_KEYPAD_NAVIGATION
                || (QApplicationPrivate::keypadNavigationEnabled() && !d->widget->hasEditFocus())
#endif
                ))
                d->popup->hide();
            if (e->isAccepted())
                return true;
        }

        // default implementation for keys not handled by the widget when popup is open
#if QT_CONFIG(shortcut)
        if (ke->matches(QKeySequence::Cancel)) {
            d->popup->hide();
            return true;
        }
#endif
        switch (key) {
#ifdef QT_KEYPAD_NAVIGATION
        case Qt::Key_Select:
            if (!QApplicationPrivate::keypadNavigationEnabled())
                break;
#endif
        case Qt::Key_Return:
        case Qt::Key_Enter:
        case Qt::Key_Tab:
            d->popup->hide();
            if (curIndex.isValid())
                d->_q_complete(curIndex);
            break;

        case Qt::Key_F4:
            if (ke->modifiers() & Qt::AltModifier)
                d->popup->hide();
            break;

        case Qt::Key_Backtab:
            d->popup->hide();
            break;

        default:
            break;
        }

        return true;
    }

#ifdef QT_KEYPAD_NAVIGATION
    case QEvent::KeyRelease: {
        if (d->widget &&
            QApplicationPrivate::keypadNavigationEnabled() && ke->key() == Qt::Key_Back) {
            QKeyEvent *ke = static_cast<QKeyEvent *>(e);
            // Send the event to the 'widget'. This is what we did for KeyPress, so we need
            // to do the same for KeyRelease, in case the widget's KeyPress event set
            // up something (such as a timer) that is relying on also receiving the
            // key release. I see this as a bug in Qt, and should really set it up for all
            // the affected keys. However, it is difficult to tell how this will affect
            // existing code, and I can't test for every combination!
            d->eatFocusOut = false;
            static_cast<QObject *>(d->widget)->event(ke);
            d->eatFocusOut = true;
        }
        break;
    }
#endif

    case QEvent::MouseButtonPress: {
#ifdef QT_KEYPAD_NAVIGATION
        if (d->widget
            && QApplicationPrivate::keypadNavigationEnabled()) {
            // if we've clicked in the widget (or its descendant), let it handle the click
            QWidget *source = qobject_cast<QWidget *>(o);
            if (source) {
                QPoint pos = source->mapToGlobal((static_cast<QMouseEvent *>(e))->pos());
                QWidget *target = QApplication::widgetAt(pos);
                if (target && (d->widget->isAncestorOf(target) ||
                    target == d->widget)) {
                    d->eatFocusOut = false;
                    static_cast<QObject *>(target)->event(e);
                    d->eatFocusOut = true;
                    return true;
                }
            }
        }
#endif
        if (!d->popup->underMouse()) {
            if (!QGuiApplicationPrivate::maybeForwardEventToVirtualKeyboard(e))
                d->popup->hide();
            return true;
        }
        }
        return false;

    case QEvent::MouseButtonRelease:
        QGuiApplicationPrivate::maybeForwardEventToVirtualKeyboard(e);
        return true;
    case QEvent::InputMethod:
    case QEvent::ShortcutOverride:
        if (d->widget)
            QCoreApplication::sendEvent(d->widget, e);
        break;

    default:
        return false;
    }
    return false;
}